

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::concat<kj::String,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,String *params,
          ArrayPtr<const_char> *params_1)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t result;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  size_t result_2;
  String local_48;
  long local_30 [2];
  
  pcVar3 = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  pcVar6 = (this->text).content.ptr;
  local_48.content.ptr = pcVar6 + -1;
  if (pcVar6 == (char *)0x0) {
    local_48.content.ptr = pcVar3;
  }
  local_48.content.size_ = (params->content).size_;
  lVar4 = 0;
  do {
    pcVar3 = pcVar3 + *(long *)((long)&local_48.content.ptr + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x10);
  __return_storage_ptr__->size_ = (size_t)pcVar3;
  local_30[0] = 0;
  local_30[1] = local_48.content.size_;
  sVar5 = 0;
  lVar4 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_30 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x10);
  heapString(&local_48,sVar5);
  pcVar6 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar6 != (char *)0x0) {
    sVar5 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar6,1,sVar5,sVar5,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_48.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_48.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_48.content.disposer;
  local_30[0] = 1;
  local_30[1] = 0;
  sVar5 = 0;
  lVar4 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_30 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x10);
  local_48.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar5,sVar5,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_48.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_48.content.size_ = sVar5;
  if (pBVar2 != (Branch *)0x0) {
    sVar5 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar5,sVar5,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_48.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_48.content.size_;
  (__return_storage_ptr__->branches).disposer = local_48.content.disposer;
  pcVar6 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar6,0,(String *)this,(ArrayPtr<const_char> *)params);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}